

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O2

error<idx2::idx2_err_code>
idx2::TraverseFirstLevel
          (idx2_file *Idx2,params *P,decode_data *D,grid *OutGrid,mmap_volume *OutVolFile,
          volume *OutVolMem)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  decode_data *pdVar7;
  undefined4 uVar8;
  i64 iVar9;
  i32 iVar10;
  undefined6 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  u64 uVar18;
  u64 *puVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  u64 uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  file_traverse *pfVar32;
  int iVar33;
  int iVar34;
  uint uVar36;
  int iVar37;
  ulong uVar35;
  ulong uVar38;
  int iVar39;
  int iVar40;
  chunk_traverse *pcVar41;
  char Level;
  long lVar42;
  int iVar43;
  ulong *puVar44;
  long *in_FS_OFFSET;
  bool bVar45;
  extent eVar46;
  v3i Brick3;
  ulong local_2e58;
  ulong local_2e38;
  decode_data *D_local;
  long local_2e28;
  int local_2e20;
  uint local_2e1c;
  brick_traverse First_2;
  undefined2 uStack_2dba;
  extent Skip_1;
  code *pcStack_2da8;
  code *pcStack_2da0;
  extent Skip;
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_2d88;
  undefined8 uStack_2d80;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2d78;
  u64 uStack_2d70;
  u64 uStack_2d68;
  i8 iStack_2d60;
  i8 iStack_2d5f;
  bool bStack_2d5e;
  bool bStack_2d5d;
  undefined2 uStack_2d5c;
  undefined2 uStack_2d5a;
  undefined6 uStack_2d58;
  undefined2 uStack_2d52;
  int iStack_2d50;
  undefined2 uStack_2d4c;
  undefined2 local_2d4a;
  u64 local_2d48;
  i32 local_2d40;
  undefined2 local_2d3c;
  extent local_2d38;
  extent local_2d28;
  ulong local_2d18;
  params *local_2d10;
  grid *local_2d08;
  extent *local_2d00;
  volume *OutVolMem_local;
  mmap_volume *OutVolFile_local;
  extent local_2ce8;
  extent BrickExtent;
  extent local_2cc8;
  extent local_2cb8;
  extent local_2ca8;
  chunk_traverse First_1;
  decode_state Ds;
  file_traverse First;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1c08;
  u64 local_1c00 [505];
  file_traverse FileStack [64];
  
  Level = Idx2->NLevels + -1;
  local_2d28.From = 0;
  local_2d28.Dims = 0;
  local_2d38.From = 0;
  local_2d38.Dims = 0;
  local_2ce8.From = 0;
  local_2ce8.Dims = 0;
  local_2cb8.From = 0;
  local_2cb8.Dims = 0;
  local_2cc8.From = 0;
  local_2cc8.Dims = 0;
  local_2d00 = &P->DecodeExtent;
  local_2ca8.From = 0;
  local_2ca8.Dims = 0;
  D_local = D;
  local_2d10 = P;
  local_2d08 = OutGrid;
  OutVolMem_local = OutVolMem;
  OutVolFile_local = OutVolFile;
  ComputeExtentsForTraversal
            (Idx2,local_2d00,Level,&local_2d28,&local_2d38,&local_2ce8,&local_2cb8,&local_2cc8,
             &local_2ca8);
  uVar29 = 0;
  if ('\0' < Level) {
    uVar29 = (int)Level;
  }
  iVar33 = 1;
  iVar43 = 1;
  iVar27 = 1;
  while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
    iVar33 = (Idx2->GroupBrick3).field_0.field_0.X * iVar33;
    iVar43 = iVar43 * (Idx2->GroupBrick3).field_0.field_0.Y;
    iVar27 = iVar27 * (Idx2->GroupBrick3).field_0.field_0.Z;
  }
  iVar31 = (Idx2->BrickDims3).field_0.field_0.X;
  iVar30 = (Idx2->BrickDims3).field_0.field_0.Y;
  iVar34 = (Idx2->BrickDims3).field_0.field_0.Z;
  local_2e1c = (int)Level;
  brick_volume::brick_volume(&Ds.ParentBrick);
  lVar15 = 0x28;
  do {
    *(undefined8 *)((long)&FileStack[0].FileOrder + lVar15) = 0;
    lVar15 = lVar15 + 0x30;
  } while (lVar15 != 0xc28);
  if ('\x0f' < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  lVar15 = (long)Level;
  lVar24 = (long)(Idx2->NFiles3).Arr[lVar15].field_0.field_0.X;
  if (lVar24 == 0) {
    uVar26 = 1;
  }
  else {
    uVar25 = lVar24 - 1;
    lVar24 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    uVar26 = 1L << (-((byte)lVar24 ^ 0x3f) & 0x3f) & 0xffffffff;
    if (uVar25 == 0) {
      uVar26 = 1;
    }
  }
  lVar24 = (long)(Idx2->NFiles3).Arr[lVar15].field_0.field_0.Y;
  uVar25 = 0x100000000;
  if (lVar24 != 0) {
    uVar35 = lVar24 - 1;
    lVar24 = 0x3f;
    if (uVar35 != 0) {
      for (; uVar35 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    if (uVar35 != 0) {
      uVar25 = 0x100000000 << (-((byte)lVar24 ^ 0x3f) & 0x3f);
    }
  }
  uVar29 = iVar31 * iVar33;
  uVar20 = iVar30 * iVar43;
  uVar21 = iVar34 * iVar27;
  lVar24 = (long)(Idx2->NFiles3).Arr[lVar15].field_0.field_0.Z;
  FileStack[0].FileTo3.field_0._8_4_ = 1;
  if (lVar24 != 0) {
    uVar35 = lVar24 - 1;
    lVar24 = 0x3f;
    if (uVar35 != 0) {
      for (; uVar35 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    FileStack[0].FileTo3.field_0._8_4_ = 1;
    if (uVar35 != 0) {
      FileStack[0].FileTo3.field_0._8_4_ = (undefined4)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
    }
  }
  FileStack[0].FileOrder = (Idx2->FilesOrder).Arr[lVar15];
  FileStack[0].PrevOrder = FileStack[0].FileOrder;
  FileStack[0].FileFrom3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  FileStack[0].FileFrom3.field_0.field_0.Z = 0;
  FileStack[0].FileTo3.field_0.field_3.XY.field_0 = uVar25 | uVar26;
  FileStack[0].Address = 0;
  local_2d18 = (ulong)(uVar21 & 0x1fffff) << 0x2a |
               (ulong)(uVar20 & 0x1fffff) << 0x15 | (ulong)(uVar29 & 0x1fffff);
  local_2e58 = 0;
  local_2e28 = lVar15;
LAB_0016ad44:
  while( true ) {
    iVar27 = 1;
    pfVar32 = FileStack + local_2e58;
    while( true ) {
      if ((int)local_2e58 < 0) {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1de;
        return (error<idx2::idx2_err_code>)ZEXT816(0x19942d);
      }
      uVar26 = pfVar32->FileOrder;
      uVar25 = uVar26 >> 2;
      pfVar32->FileOrder = uVar25;
      uVar36 = (uint)uVar26 & 3;
      if (uVar36 != 3) break;
      if (uVar25 == 3) {
        pfVar32->FileOrder = FileStack[local_2e58].PrevOrder;
      }
      else {
        FileStack[local_2e58].PrevOrder = uVar25;
      }
    }
    uVar26 = (ulong)((int)local_2e58 - 1);
    iVar33 = FileStack[local_2e58].FileFrom3.field_0.field_0.X;
    if (((FileStack[local_2e58].FileTo3.field_0.field_0.X - iVar33 == 1) &&
        (iVar43 = FileStack[local_2e58].FileFrom3.field_0.field_0.Y,
        FileStack[local_2e58].FileTo3.field_0.field_0.Y - iVar43 == 1)) &&
       (iVar31 = FileStack[local_2e58].FileFrom3.field_0.field_0.Z,
       FileStack[local_2e58].FileTo3.field_0.field_0.Z - iVar31 == 1)) break;
    First.FileOrder = pfVar32->FileOrder;
    First.PrevOrder = FileStack[local_2e58].PrevOrder;
    First.FileFrom3.field_0.field_3.XY.field_0 =
         (v2<int>)*(undefined8 *)&FileStack[local_2e58].FileFrom3.field_0;
    uVar5 = *(undefined8 *)((long)&FileStack[local_2e58].FileFrom3.field_0 + 8);
    uVar4 = *(undefined8 *)((long)&FileStack[local_2e58].FileTo3.field_0 + 4);
    First.FileTo3.field_0.field_0.Y = (int)uVar4;
    First.FileTo3.field_0.field_0.Z = (int)((ulong)uVar4 >> 0x20);
    First.Address = FileStack[local_2e58].Address;
    First.FileFrom3.field_0.field_0.Z = (int)uVar5;
    First.FileTo3.field_0.field_0.X = (int)((ulong)uVar5 >> 0x20);
    uVar4 = *(undefined8 *)((long)&FileStack[local_2e58].FileTo3.field_0 + 4);
    First_1.ChunkTo3.field_0.field_0.Y = (int)uVar4;
    First_1.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar4 >> 0x20);
    First_1.ChunkOrder = pfVar32->FileOrder;
    First_1.PrevOrder = FileStack[local_2e58].PrevOrder;
    uVar4 = *(undefined8 *)((long)&FileStack[local_2e58].FileFrom3.field_0 + 8);
    First_1.ChunkFrom3.field_0.field_3.XY.field_0 =
         (v2<int>)(v2<int>)FileStack[local_2e58].FileFrom3.field_0.field_3.XY.field_0;
    First_1.ChunkFrom3.field_0.field_0.Z = (int)uVar4;
    First_1.ChunkTo3.field_0.field_0.X = (int)((ulong)uVar4 >> 0x20);
    uVar25 = (ulong)(uVar36 << 2);
    iVar27 = *(int *)((long)&FileStack[local_2e58].FileFrom3.field_0 + uVar25);
    iVar27 = (*(int *)((long)&FileStack[local_2e58].FileTo3.field_0 + uVar25) - iVar27) / 2 + iVar27
    ;
    *(int *)((long)&First.FileTo3.field_0 + uVar25) = iVar27;
    *(int *)((long)&First_1.ChunkFrom3.field_0 + uVar25) = iVar27;
    First.Address = FileStack[local_2e58].Address;
    First_1.NChunksBefore =
         (long)(First.FileTo3.field_0.field_0.Z - First.FileFrom3.field_0._8_4_) *
         (long)(First.FileTo3.field_0.field_0.Y - First.FileFrom3.field_0._4_4_) *
         (long)(First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_) + First.Address;
    iVar34 = (int)((long)(local_2ce8.From << 0x2b) >> 0x2b);
    iVar31 = (((int)local_2ce8.Dims << 0xb) >> 0xb) + iVar34;
    iVar43 = (int)((long)(local_2ce8.From * 2) >> 0x2b);
    iVar33 = (int)((long)(local_2ce8.Dims * 2) >> 0x2b) + iVar43;
    iVar30 = (int)(((long)(local_2ce8.Dims << 0x16) >> 0xb) +
                   ((long)(local_2ce8.From << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
    iVar27 = (int)((long)(local_2ce8.From << 0x16) >> 0x2b);
    if (((First_1.ChunkFrom3.field_0.field_0.X < iVar31) &&
        (First_1.ChunkFrom3.field_0.field_0.Y < iVar30)) &&
       (((First_1.ChunkFrom3.field_0.field_0.Z < iVar33 &&
         ((iVar34 < First_1.ChunkTo3.field_0.field_0.X &&
          (iVar27 < First_1.ChunkTo3.field_0.field_0.Y)))) &&
        (iVar43 < First_1.ChunkTo3.field_0.field_0.Z)))) {
      FileStack[local_2e58].FileFrom3.field_0.field_3.XY.field_0 =
           (anon_union_8_4_6ba14846_for_v2<int>_1)First_1.ChunkFrom3.field_0.field_3.XY.field_0;
      *(ulong *)((long)&FileStack[local_2e58].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
           CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
      *(ulong *)((long)&FileStack[local_2e58].FileTo3.field_0.field_3.XY.field_0 + 4) =
           CONCAT44(First_1.ChunkTo3.field_0.field_0.Z,First_1.ChunkTo3.field_0.field_0.Y);
      FileStack[local_2e58].Address = First_1.NChunksBefore;
      pfVar32->FileOrder = First_1.ChunkOrder;
      FileStack[local_2e58].PrevOrder = First_1.PrevOrder;
      FileStack[local_2e58].FileFrom3.field_0.field_3.XY.field_0 =
           (anon_union_8_4_6ba14846_for_v2<int>_1)First_1.ChunkFrom3.field_0.field_3.XY.field_0;
      *(ulong *)((long)&FileStack[local_2e58].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
           CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
      uVar26 = local_2e58;
    }
    local_2e58 = uVar26;
    if ((((First.FileFrom3.field_0.field_0.X < iVar31) &&
         (First.FileFrom3.field_0.field_0.Y < iVar30)) &&
        (First.FileFrom3.field_0.field_0.Z < iVar33)) &&
       ((iVar34 < First.FileTo3.field_0.field_0.X &&
        (iVar43 < First.FileTo3.field_0.field_0.Z && iVar27 < First.FileTo3.field_0.field_0.Y)))) {
      local_2e58 = (ulong)((int)local_2e58 + 1);
      *(undefined8 *)&FileStack[local_2e58].FileFrom3.field_0 =
           First.FileFrom3.field_0.field_3.XY.field_0;
      *(ulong *)((long)&FileStack[local_2e58].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
           CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
      *(ulong *)((long)&FileStack[local_2e58].FileTo3.field_0.field_3.XY.field_0 + 4) =
           CONCAT44(First.FileTo3.field_0.field_0.Z,First.FileTo3.field_0.field_0.Y);
      FileStack[local_2e58].Address = First.Address;
      FileStack[local_2e58].FileOrder = First.FileOrder;
      FileStack[local_2e58].PrevOrder = First.PrevOrder;
      *(undefined8 *)&FileStack[local_2e58].FileFrom3.field_0 =
           First.FileFrom3.field_0.field_3.XY.field_0;
      *(ulong *)((long)&FileStack[local_2e58].FileFrom3.field_0.field_4.YZ.field_0 + 4) =
           CONCAT44(First.FileTo3.field_0.field_0.X,First.FileFrom3.field_0.field_0.Z);
    }
  }
  lVar24 = 0x38;
  do {
    *(undefined8 *)((long)&Ds.Brick + lVar24) = 0;
    *(undefined4 *)((long)&Ds.BrickInChunk + lVar24) = 0;
    *(undefined8 *)((long)&First.FileOrder + lVar24) = 0;
    lVar24 = lVar24 + 0x40;
  } while (lVar24 != 0x1038);
  iVar30 = (Idx2->ChunksPerFile3s).Arr[lVar15].field_0.field_0.X;
  iVar37 = 1;
  iVar34 = iVar27;
  if ((long)iVar30 != 0) {
    uVar25 = (long)iVar30 - 1;
    lVar24 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    iVar34 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
    if (uVar25 == 0) {
      iVar34 = iVar37;
    }
  }
  iVar40 = (Idx2->ChunksPerFile3s).Arr[lVar15].field_0.field_0.Y;
  iVar39 = iVar27;
  if ((long)iVar40 != 0) {
    uVar25 = (long)iVar40 - 1;
    lVar24 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    iVar39 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
    if (uVar25 == 0) {
      iVar39 = iVar37;
    }
  }
  iVar2 = (Idx2->ChunksPerFile3s).Arr[lVar15].field_0.field_0.Z;
  if ((long)iVar2 != 0) {
    uVar25 = (long)iVar2 - 1;
    lVar24 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    iVar27 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
    if (uVar25 == 0) {
      iVar27 = iVar37;
    }
  }
  First.FileOrder = (Idx2->ChunksOrderInFile).Arr[local_2e28];
  iVar30 = iVar30 * iVar33;
  iVar40 = iVar40 * iVar43;
  First.FileFrom3.field_0.field_0.Z = iVar2 * iVar31;
  First.FileFrom3.field_0.field_0.Y = iVar40;
  First.FileFrom3.field_0.field_0.X = iVar30;
  First.PrevOrder = First.FileOrder;
  First.FileTo3.field_0.field_0.X = iVar34 + iVar30;
  First.FileTo3.field_0.field_0.Y = iVar39 + iVar40;
  First.FileTo3.field_0.field_0.Z = iVar27 + First.FileFrom3.field_0.field_0.Z;
  First.Address = 0;
  local_1c08.field_0.X = 0;
  local_1c00[0] = 0;
  local_2e38 = 0;
LAB_0016aeed:
  do {
    iVar27 = 1;
    puVar44 = (ulong *)(local_1c08.E + local_2e38 * 0x10 + -0xc);
    while( true ) {
      local_2e58 = uVar26;
      if ((int)local_2e38 < 0) goto LAB_0016ad44;
      uVar25 = *puVar44;
      uVar35 = uVar25 >> 2;
      *puVar44 = uVar35;
      uVar36 = (uint)uVar25 & 3;
      if (uVar36 != 3) break;
      if (uVar35 == 3) {
        *puVar44 = *(ulong *)(local_1c08.E + local_2e38 * 0x10 + -10);
      }
      else {
        *(ulong *)(local_1c08.E + local_2e38 * 0x10 + -10) = uVar35;
      }
    }
    uVar25 = (ulong)((int)local_2e38 - 1);
    iVar33 = local_1c08.E[local_2e38 * 0x10 + -8];
    if (((local_1c08.E[local_2e38 * 0x10 + -5] - iVar33 == 1) &&
        (iVar43 = local_1c08.E[local_2e38 * 0x10 + -7],
        local_1c08.E[local_2e38 * 0x10 + -4] - iVar43 == 1)) &&
       (iVar31 = local_1c08.E[local_2e38 * 0x10 + -6],
       local_1c08.E[local_2e38 * 0x10 + -3] - iVar31 == 1)) {
      lVar24 = 0x38;
      do {
        *(undefined8 *)((long)&local_2ca8.From + lVar24) = 0;
        *(undefined4 *)((long)&local_2ca8.Dims + lVar24) = 0;
        *(undefined8 *)((long)&First_1.ChunkOrder + lVar24) = 0;
        lVar24 = lVar24 + 0x40;
      } while (lVar24 != 0x1038);
      iVar30 = (Idx2->BricksPerChunk3s).Arr[lVar15].field_0.field_0.X;
      iVar37 = 1;
      iVar34 = iVar27;
      if ((long)iVar30 != 0) {
        uVar35 = (long)iVar30 - 1;
        lVar24 = 0x3f;
        if (uVar35 != 0) {
          for (; uVar35 >> lVar24 == 0; lVar24 = lVar24 + -1) {
          }
        }
        iVar34 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
        if (uVar35 == 0) {
          iVar34 = iVar37;
        }
      }
      iVar40 = (Idx2->BricksPerChunk3s).Arr[lVar15].field_0.field_0.Y;
      iVar39 = iVar27;
      if ((long)iVar40 != 0) {
        uVar35 = (long)iVar40 - 1;
        lVar24 = 0x3f;
        if (uVar35 != 0) {
          for (; uVar35 >> lVar24 == 0; lVar24 = lVar24 + -1) {
          }
        }
        iVar39 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
        if (uVar35 == 0) {
          iVar39 = iVar37;
        }
      }
      iVar2 = (Idx2->BricksPerChunk3s).Arr[lVar15].field_0.field_0.Z;
      if ((long)iVar2 != 0) {
        uVar35 = (long)iVar2 - 1;
        lVar24 = 0x3f;
        if (uVar35 != 0) {
          for (; uVar35 >> lVar24 == 0; lVar24 = lVar24 + -1) {
          }
        }
        iVar27 = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
        if (uVar35 == 0) {
          iVar27 = iVar37;
        }
      }
      First_1.ChunkOrder = (Idx2->BricksOrderInChunk).Arr[local_2e28];
      iVar30 = iVar30 * iVar33;
      iVar40 = iVar40 * iVar43;
      First_1.ChunkFrom3.field_0.field_0.Z = iVar2 * iVar31;
      First_1.ChunkFrom3.field_0.field_0.Y = iVar40;
      First_1.ChunkFrom3.field_0.field_0.X = iVar30;
      First_1.ChunkTo3.field_0.field_0.X = iVar34 + iVar30;
      uVar38 = (ulong)(uint)First_1.ChunkTo3.field_0.field_0.X;
      First_1.PrevOrder = First_1.ChunkOrder;
      First_1.ChunkTo3.field_0.field_0.Y = iVar39 + iVar40;
      First_1.ChunkTo3.field_0.field_0.Z = iVar27 + First_1.ChunkFrom3.field_0.field_0.Z;
      First_1.NChunksBefore = 0;
      First_1._48_8_ = First_1._48_8_ & 0xffffffff00000000;
      First_1.Address = 0;
      uVar35 = 0;
      do {
        pcVar41 = &First_1 + uVar35;
        while( true ) {
          local_2e38 = uVar25;
          if ((int)uVar35 < 0) goto LAB_0016aeed;
          uVar17 = pcVar41->ChunkOrder;
          uVar16 = uVar17 >> 2;
          pcVar41->ChunkOrder = uVar16;
          uVar36 = (uint)uVar17 & 3;
          if (uVar36 != 3) break;
          if (uVar16 == 3) {
            pcVar41->ChunkOrder = (&First_1)[uVar35].PrevOrder;
          }
          else {
            (&First_1)[uVar35].PrevOrder = uVar16;
          }
        }
        uVar17 = (ulong)((int)uVar35 - 1);
        iVar27 = (&First_1)[uVar35].ChunkFrom3.field_0.field_0.X;
        if ((((&First_1)[uVar35].ChunkTo3.field_0.field_0.X - iVar27 == 1) &&
            (iVar33 = (&First_1)[uVar35].ChunkFrom3.field_0.field_0.Y,
            (&First_1)[uVar35].ChunkTo3.field_0.field_0.Y - iVar33 == 1)) &&
           (uVar3 = (&First_1)[uVar35].ChunkFrom3.field_0.field_0.Z,
           (&First_1)[uVar35].ChunkTo3.field_0.field_0.Z - uVar3 == 1)) {
          BrickExtent.From =
               (ulong)(uVar3 * uVar21 & 0x1fffff) << 0x2a |
               (ulong)(iVar33 * uVar20 & 0x1fffff) << 0x15 | (ulong)(iVar27 * uVar29 & 0x1fffff);
          BrickExtent.Dims = local_2d18;
          eVar46 = Crop<idx2::extent,idx2::extent>(&BrickExtent,local_2d00);
          std::unique_lock<std::mutex>::unique_lock
                    ((unique_lock<std::mutex> *)&First_2,&D_local->Mutex);
          D_local->NTasks = D_local->NTasks + 1;
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&First_2);
          brick_volume::brick_volume((brick_volume *)&Skip);
          local_2d40 = (&First_1)[uVar35].ChunkInFile;
          local_2d3c = CONCAT11(local_2d3c._1_1_,Level);
          iStack_2d50 = (&First_1)[uVar35].ChunkFrom3.field_0.field_0.Z;
          uVar4 = *(undefined8 *)&(&First_1)[uVar35].ChunkFrom3.field_0;
          uStack_2d58 = (undefined6)uVar4;
          uStack_2d52 = (undefined2)((ulong)uVar4 >> 0x30);
          Brick3.field_0.field_0.Y = 0;
          Brick3.field_0.field_0.X = uVar3;
          Brick3.field_0._8_4_ = (undefined4)uVar38;
          uVar38 = uVar38 & 0xffffffff;
          uVar18 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_2e1c,
                                  (int)*(undefined8 *)&(&First_1)[uVar35].ChunkFrom3.field_0,Brick3)
          ;
          uVar13 = local_2d3c;
          iVar10 = local_2d40;
          uVar12 = local_2d4a;
          uVar11 = uStack_2d58;
          pdVar7 = D_local;
          auVar6._8_4_ = iStack_2d50;
          auVar6._6_2_ = uStack_2d52;
          auVar6._12_2_ = uStack_2d4c;
          First_2.BrickTo3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_2d78;
          First_2.NBricksBefore = uStack_2d70;
          First_2._48_8_ = uStack_2d68;
          First_2.Address._0_1_ = iStack_2d60;
          First_2.Address._1_1_ = iStack_2d5f;
          First_2.Address._2_1_ = bStack_2d5e;
          First_2.Address._3_1_ = bStack_2d5d;
          First_2.Address._4_2_ = uStack_2d5c;
          First_2.Address._6_2_ = uStack_2d5a;
          First_2.BrickOrder = Skip.From;
          First_2.PrevOrder = Skip.Dims;
          First_2.BrickFrom3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)aStack_2d88;
          First_2._24_8_ = uStack_2d80;
          _Skip_1 = (value_type)(ZEXT832(0) << 0x20);
          local_2d48 = uVar18;
          puVar19 = (u64 *)operator_new(0xa8);
          auVar6._0_6_ = uVar11;
          auVar6._14_2_ = uVar12;
          auVar6._16_8_ = uVar18;
          auVar6._24_4_ = iVar10;
          auVar6._28_2_ = uVar13;
          auVar6._30_2_ = uStack_2dba;
          *(undefined1 (*) [32])(puVar19 + 8) = auVar6;
          ((v2<int> *)(puVar19 + 4))->field_0 =
               (anon_union_8_4_6ba14846_for_v2<int>_1)First_2.BrickTo3.field_0.field_4.YZ.field_0;
          puVar19[5] = First_2.NBricksBefore;
          puVar19[6] = First_2._48_8_;
          puVar19[7] = CONCAT26(First_2.Address._6_2_,First_2.Address._0_6_);
          *puVar19 = First_2.BrickOrder;
          puVar19[1] = First_2.PrevOrder;
          ((v2<int> *)(puVar19 + 2))->field_0 =
               (anon_union_8_4_6ba14846_for_v2<int>_1)First_2.BrickFrom3.field_0.field_3.XY.field_0;
          puVar19[3] = First_2._24_8_;
          *(extent *)(puVar19 + 0xc) = eVar46;
          puVar19[0xe] = (u64)Idx2;
          puVar19[0xf] = (u64)local_2d10;
          puVar19[0x10] = (u64)&D_local;
          puVar19[0x11] = (u64)local_2d08;
          puVar19[0x12] = (u64)&OutVolFile_local;
          puVar19[0x13] = (u64)&OutVolMem_local;
          Skip_1.From = (u64)puVar19;
          pcStack_2da8 = std::
                         _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                         ::_M_manager;
          pcStack_2da0 = std::
                         _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:439:3)_()>_>
                         ::_M_invoke;
          __mutex = &(pdVar7->ThreadPool).tasks_mutex;
          std::mutex::lock(__mutex);
          std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                    (&(pdVar7->ThreadPool).tasks.c,(value_type *)&Skip_1);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          LOCK();
          paVar1 = &(pdVar7->ThreadPool).tasks_total;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          std::condition_variable::notify_one();
          std::_Function_base::~_Function_base((_Function_base *)&Skip_1);
          uVar35 = uVar17;
        }
        else {
          First_2.BrickOrder = pcVar41->ChunkOrder;
          First_2.PrevOrder = (&First_1)[uVar35].PrevOrder;
          uVar38 = *(ulong *)&(&First_1)[uVar35].ChunkFrom3.field_0;
          First_2._24_8_ = *(undefined8 *)((long)&(&First_1)[uVar35].ChunkFrom3.field_0 + 8);
          First_2.BrickTo3.field_0.field_4.YZ.field_0 =
               (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         ((long)&(&First_1)[uVar35].ChunkTo3.field_0.field_3.XY.field_0 + 4);
          First_2.NBricksBefore = (&First_1)[uVar35].NChunksBefore;
          First_2.BrickInChunk = (&First_1)[uVar35].ChunkInFile;
          First_2._52_4_ = *(undefined4 *)&(&First_1)[uVar35].field_0x34;
          First_2.Address._0_6_ = SUB86((&First_1)[uVar35].Address,0);
          First_2.Address._6_2_ = SUB82((&First_1)[uVar35].Address >> 0x30,0);
          Skip.From = pcVar41->ChunkOrder;
          Skip.Dims = (&First_1)[uVar35].PrevOrder;
          aStack_2d88 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                        *(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         &(&First_1)[uVar35].ChunkFrom3.field_0;
          uStack_2d80 = *(u64 *)((long)&(&First_1)[uVar35].ChunkFrom3.field_0.field_4.YZ.field_0 + 4
                                );
          local_2d78 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                       *(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                        &((anon_union_8_4_6ba14846_for_v2<int>_1 *)
                         ((long)&(&First_1)[uVar35].ChunkTo3.field_0.field_3.XY.field_0 + 4))->
                         field_0;
          uStack_2d70 = (&First_1)[uVar35].NChunksBefore;
          uStack_2d68 = *(u64 *)&(&First_1)[uVar35].ChunkInFile;
          uVar16 = (ulong)(uVar36 << 2);
          iVar27 = *(int *)((long)&(&First_1)[uVar35].ChunkFrom3.field_0 + uVar16);
          iVar27 = (*(int *)((long)&(&First_1)[uVar35].ChunkTo3.field_0 + uVar16) - iVar27) / 2 +
                   iVar27;
          *(int *)((long)&First_2.BrickTo3.field_0 + uVar16) = iVar27;
          iVar9 = First_2.NBricksBefore;
          *(int *)((long)&aStack_2d88 + uVar16) = iVar27;
          First_2.BrickFrom3.field_0.field_0.X = (int)uVar38;
          uVar8 = First_2.BrickFrom3.field_0.field_0.X;
          First_2.BrickFrom3.field_0.field_0.Y = (int)(uVar38 >> 0x20);
          local_2e20 = First_2.BrickTo3.field_0.field_0.X;
          uVar36 = First_2.BrickTo3.field_0.field_0.X - First_2.BrickFrom3.field_0._0_4_;
          lVar42 = (long)First_2.BrickTo3.field_0.field_0.Y;
          lVar24 = (long)First_2.BrickFrom3.field_0.field_0.Y;
          lVar28 = (long)First_2.BrickTo3.field_0.field_0.Z;
          lVar22 = (long)First_2.BrickFrom3.field_0.field_0.Z;
          Skip_1.Dims = (ulong)((uint)(lVar28 - lVar22) & 0x1fffff) << 0x2a |
                        (ulong)((uint)(lVar42 - lVar24) & 0x1fffff) << 0x15 |
                        (ulong)(uVar36 & 0x1fffff);
          Skip_1.From = (ulong)(First_2.BrickFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                        ((ulong)(uint)First_2.BrickFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                        uVar38 & 0x1fffff;
          First_2.BrickFrom3.field_0._0_8_ = uVar38;
          eVar46 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2d28);
          uVar18 = eVar46.Dims;
          uStack_2d70 = ((long)(uVar18 << 0x16) >> 0x2b) * ((long)(uVar18 << 0x2b) >> 0x2b) *
                        ((long)(uVar18 * 2) >> 0x2b) + iVar9;
          iVar10 = First_2.BrickInChunk;
          eVar46 = Crop<idx2::extent,idx2::extent>(&Skip_1,&local_2cb8);
          uStack_2d68 = CONCAT44(uStack_2d68._4_4_,
                                 (((int)eVar46.Dims << 0xb) >> 0xb) *
                                 (int)((long)(eVar46.Dims * 2) >> 0x2b) *
                                 (int)((long)(eVar46.Dims << 0x16) >> 0x2b) + iVar10);
          uVar18 = (&First_1)[uVar35].Address;
          First_2.Address._0_6_ = SUB86(uVar18,0);
          First_2.Address._6_2_ = SUB82(uVar18 >> 0x30,0);
          uVar23 = (long)(int)uVar36 * (lVar42 - lVar24) * (lVar28 - lVar22) + uVar18;
          _iStack_2d60 = (undefined6)uVar23;
          uStack_2d5a = (undefined2)(uVar23 >> 0x30);
          uVar38 = ((long)(local_2d28.Dims << 0x16) >> 0xb) +
                   ((long)(local_2d28.From << 0x16) >> 0xb & 0xffffffff00000000U);
          iVar43 = (int)((long)(local_2d28.From << 0x2b) >> 0x2b);
          iVar31 = (((int)local_2d28.Dims << 0xb) >> 0xb) + iVar43;
          iVar27 = (int)((long)(local_2d28.From * 2) >> 0x2b);
          iVar30 = (int)((long)(local_2d28.Dims * 2) >> 0x2b) + iVar27;
          iVar34 = (int)(uVar38 >> 0x20);
          iVar33 = (int)((long)(local_2d28.From << 0x16) >> 0x2b);
          if (((((aStack_2d88.field_0.X < iVar31) && (aStack_2d88.field_0.Y < iVar34)) &&
               ((int)uStack_2d80 < iVar30)) &&
              ((iVar43 < uStack_2d80._4_4_ && (iVar33 < (int)local_2d78._0_4_)))) &&
             (iVar27 < (int)local_2d78._4_4_)) {
            ((anon_union_8_4_6ba14846_for_v2<int>_1 *)
            ((long)&(&First_1)[uVar35].ChunkTo3.field_0 + 4))->field_0 =
                 (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)local_2d78;
            (&First_1)[uVar35].NChunksBefore = uStack_2d70;
            *(u64 *)&(&First_1)[uVar35].ChunkInFile = uStack_2d68;
            (&First_1)[uVar35].Address = uVar23;
            pcVar41->ChunkOrder = Skip.From;
            (&First_1)[uVar35].PrevOrder = Skip.Dims;
            *(anon_union_8_4_6ba14846_for_v2<int>_1 *)&(&First_1)[uVar35].ChunkFrom3.field_0 =
                 (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)aStack_2d88;
            *(u64 *)((long)&(&First_1)[uVar35].ChunkFrom3.field_0 + 8) = uStack_2d80;
            uVar17 = uVar35;
          }
          uVar35 = uVar17;
          if ((int)uVar8 < iVar31) {
            uVar38 = uVar38 >> 0x20;
            if (((First_2.BrickFrom3.field_0.field_0.Y < iVar34) &&
                (First_2.BrickFrom3.field_0.field_0.Z < iVar30)) &&
               ((iVar43 < local_2e20 &&
                ((iVar33 < First_2.BrickTo3.field_0.field_0.Y &&
                 (iVar27 < First_2.BrickTo3.field_0.field_0.Z)))))) {
              uVar35 = (ulong)((int)uVar35 + 1);
              ((v2<int> *)((long)&(&First_1)[uVar35].ChunkTo3.field_0.field_3.XY.field_0 + 4))->
              field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                        First_2.BrickTo3.field_0.field_4.YZ.field_0;
              (&First_1)[uVar35].NChunksBefore = First_2.NBricksBefore;
              (&First_1)[uVar35].ChunkInFile = First_2.BrickInChunk;
              *(undefined4 *)&(&First_1)[uVar35].field_0x34 = First_2._52_4_;
              (&First_1)[uVar35].Address = uVar18;
              (&First_1)[uVar35].ChunkOrder = First_2.BrickOrder;
              (&First_1)[uVar35].PrevOrder = First_2.PrevOrder;
              (&First_1)[uVar35].ChunkFrom3.field_0.field_3.XY.field_0 =
                   (anon_union_8_4_6ba14846_for_v2<int>_1)
                   First_2.BrickFrom3.field_0.field_3.XY.field_0;
              *(undefined8 *)((long)&(&First_1)[uVar35].ChunkFrom3.field_0.field_4.YZ.field_0 + 4) =
                   First_2._24_8_;
            }
          }
        }
      } while( true );
    }
    First_1.ChunkTo3.field_0.field_0.Y = (int)*(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -4)
    ;
    First_1.ChunkTo3.field_0.field_0.Z =
         (int)((ulong)*(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -4) >> 0x20);
    First_1.NChunksBefore = *(i64 *)(local_1c08.E + local_2e38 * 0x10 + -2);
    First_1.ChunkInFile = (local_1c08.E + local_2e38 * 0x10)[0];
    First_1._52_4_ = (local_1c08.E + local_2e38 * 0x10)[1];
    First_1.Address = local_1c00[local_2e38 * 8];
    First_1.ChunkOrder = *puVar44;
    First_1.PrevOrder = *(u64 *)(local_1c08.E + local_2e38 * 0x10 + -10);
    First_1.ChunkFrom3.field_0.field_3.XY.field_0 =
         (v2<int>)(v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)
                            (local_1c08.E + local_2e38 * 0x10 + -8);
    First_1.ChunkFrom3.field_0.field_0.Z =
         (int)*(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -6);
    First_1.ChunkTo3.field_0.field_0.X =
         (int)((ulong)*(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -6) >> 0x20);
    First_2.BrickOrder = *puVar44;
    First_2.PrevOrder = *(u64 *)(local_1c08.E + local_2e38 * 0x10 + -10);
    First_2.BrickFrom3.field_0.field_3.XY.field_0 =
         (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_1c08.E + local_2e38 * 0x10 + -8);
    First_2._24_8_ = *(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -6);
    First_2.BrickTo3.field_0.field_4.YZ.field_0 =
         (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_1c08.E + local_2e38 * 0x10 + -4);
    First_2.NBricksBefore = *(i64 *)(local_1c08.E + local_2e38 * 0x10 + -2);
    First_2.BrickInChunk = (local_1c08.E + local_2e38 * 0x10)[0];
    First_2._52_4_ = (local_1c08.E + local_2e38 * 0x10)[1];
    uVar35 = (ulong)(uVar36 << 2);
    iVar27 = *(int *)((long)&First + uVar35 + local_2e38 * 0x40 + 0x10);
    iVar27 = (*(int *)((long)&First + uVar35 + local_2e38 * 0x40 + 0x1c) - iVar27) / 2 + iVar27;
    *(int *)((long)&First_1.ChunkTo3.field_0 + uVar35) = iVar27;
    *(int *)((long)&First_2.BrickFrom3.field_0 + uVar35) = iVar27;
    iVar9 = First_1.NChunksBefore;
    uVar14 = First_1.ChunkTo3.field_0.field_0.X;
    uVar8 = First_1.ChunkFrom3.field_0.field_0.X;
    uVar36 = First_1.ChunkTo3.field_0.field_0.X - First_1.ChunkFrom3.field_0._0_4_;
    lVar42 = (long)First_1.ChunkTo3.field_0.field_0.Y;
    lVar24 = (long)First_1.ChunkFrom3.field_0.field_0.Y;
    lVar28 = (long)First_1.ChunkTo3.field_0.field_0.Z;
    lVar22 = (long)First_1.ChunkFrom3.field_0.field_0.Z;
    Skip.From = (ulong)(First_1.ChunkFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                ((ulong)(uint)First_1.ChunkFrom3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                (ulong)First_1.ChunkFrom3.field_0.field_3.XY.field_0 & 0x1fffff;
    Skip.Dims = (ulong)((uint)(lVar28 - lVar22) & 0x1fffff) << 0x2a |
                (ulong)((uint)(lVar42 - lVar24) & 0x1fffff) << 0x15 | (ulong)(uVar36 & 0x1fffff);
    eVar46 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2d38);
    uVar18 = eVar46.Dims;
    First_2.NBricksBefore =
         ((long)(uVar18 << 0x16) >> 0x2b) * ((long)(uVar18 << 0x2b) >> 0x2b) *
         ((long)(uVar18 * 2) >> 0x2b) + iVar9;
    iVar10 = First_1.ChunkInFile;
    eVar46 = Crop<idx2::extent,idx2::extent>(&Skip,&local_2cc8);
    iVar43 = (((int)eVar46.Dims << 0xb) >> 0xb) * (int)((long)(eVar46.Dims * 2) >> 0x2b) *
             (int)((long)(eVar46.Dims << 0x16) >> 0x2b) + iVar10;
    First_2.BrickInChunk = iVar43;
    First_1.Address = local_1c00[local_2e38 * 8];
    uVar18 = (long)(int)uVar36 * (lVar42 - lVar24) * (lVar28 - lVar22) + First_1.Address;
    First_2.Address._0_6_ = SUB86(uVar18,0);
    First_2.Address._6_2_ = SUB82(uVar18 >> 0x30,0);
    iVar31 = (int)((long)(local_2d38.From << 0x2b) >> 0x2b);
    iVar30 = (((int)local_2d38.Dims << 0xb) >> 0xb) + iVar31;
    iVar27 = (int)((long)(local_2d38.From * 2) >> 0x2b);
    iVar34 = (int)((long)(local_2d38.Dims * 2) >> 0x2b) + iVar27;
    iVar37 = (int)(((long)(local_2d38.Dims << 0x16) >> 0xb) +
                   ((long)(local_2d38.From << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
    iVar33 = (int)((long)(local_2d38.From << 0x16) >> 0x2b);
    if ((((First_2.BrickFrom3.field_0.field_0.X < iVar30) &&
         (First_2.BrickFrom3.field_0.field_0.Y < iVar37)) &&
        (First_2.BrickFrom3.field_0.field_0.Z < iVar34)) &&
       (((iVar31 < First_2.BrickTo3.field_0.field_0.X &&
         (iVar33 < First_2.BrickTo3.field_0.field_0.Y)) &&
        (iVar27 < First_2.BrickTo3.field_0.field_0.Z)))) {
      ((v2<int> *)(local_1c08.E + local_2e38 * 0x10 + -4))->field_0 =
           (anon_union_8_4_6ba14846_for_v2<int>_1)First_2.BrickTo3.field_0.field_4.YZ.field_0;
      *(i64 *)(local_1c08.E + local_2e38 * 0x10 + -2) = First_2.NBricksBefore;
      (local_1c08.E + local_2e38 * 0x10)[0] = iVar43;
      (local_1c08.E + local_2e38 * 0x10)[1] = First_2._52_4_;
      local_1c00[local_2e38 * 8] = uVar18;
      *puVar44 = First_2.BrickOrder;
      *(u64 *)(local_1c08.E + local_2e38 * 0x10 + -10) = First_2.PrevOrder;
      ((v2<int> *)(local_1c08.E + local_2e38 * 0x10 + -8))->field_0 =
           (anon_union_8_4_6ba14846_for_v2<int>_1)First_2.BrickFrom3.field_0.field_3.XY.field_0;
      *(undefined8 *)(local_1c08.E + local_2e38 * 0x10 + -6) = First_2._24_8_;
      uVar25 = local_2e38;
    }
    local_2e38 = uVar25;
    if ((((int)uVar8 < iVar30) && (First_1.ChunkFrom3.field_0.field_0.Y < iVar37)) &&
       ((First_1.ChunkFrom3.field_0.field_0.Z < iVar34 &&
        (((iVar31 < (int)uVar14 && (iVar33 < First_1.ChunkTo3.field_0.field_0.Y)) &&
         (iVar27 < First_1.ChunkTo3.field_0.field_0.Z)))))) {
      local_2e38 = (ulong)((int)local_2e38 + 1);
      *(ulong *)(local_1c08.E + local_2e38 * 0x10 + -4) =
           CONCAT44(First_1.ChunkTo3.field_0.field_0.Z,First_1.ChunkTo3.field_0.field_0.Y);
      *(i64 *)(local_1c08.E + local_2e38 * 0x10 + -2) = First_1.NChunksBefore;
      (local_1c08.E + local_2e38 * 0x10)[0] = First_1.ChunkInFile;
      (local_1c08.E + local_2e38 * 0x10)[1] = First_1._52_4_;
      local_1c00[local_2e38 * 8] = First_1.Address;
      *(u64 *)(local_1c08.E + local_2e38 * 0x10 + -0xc) = First_1.ChunkOrder;
      *(u64 *)(local_1c08.E + local_2e38 * 0x10 + -10) = First_1.PrevOrder;
      ((v2<int> *)(local_1c08.E + local_2e38 * 0x10 + -8))->field_0 =
           (anon_union_8_4_6ba14846_for_v2<int>_1)First_1.ChunkFrom3.field_0.field_3.XY.field_0;
      *(ulong *)(local_1c08.E + local_2e38 * 0x10 + -6) =
           CONCAT44(First_1.ChunkTo3.field_0.field_0.X,First_1.ChunkFrom3.field_0.field_0.Z);
    }
  } while( true );
}

Assistant:

error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}